

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5AtomicCountersArrayIndexing.cpp
# Opt level: O2

IterateResult __thiscall
glcts::GPUShader5AtomicCountersArrayIndexing::iterate(GPUShader5AtomicCountersArrayIndexing *this)

{
  ostringstream *this_00;
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  uint *value;
  MessageBuilder *pMVar4;
  char *description;
  qpTestResult testResult;
  TestContext *this_01;
  undefined1 local_1b0 [384];
  long lVar3;
  
  initTest(this);
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x1680))(this->m_program_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Could not use program object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5AtomicCountersArrayIndexing.cpp"
                  ,0x84);
  (**(code **)(lVar3 + 0x528))(10,10,1);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Failed to dispatch compute operation!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5AtomicCountersArrayIndexing.cpp"
                  ,0x89);
  value = (uint *)(**(code **)(lVar3 + 0xd00))(0x92c0,0,0x10,1);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Failed to map buffer range to client space!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5AtomicCountersArrayIndexing.cpp"
                  ,0x8f);
  if ((((*value == 1000) && (value[1] == 0x3e9)) && (value[2] == 0x3ea)) && (value[3] == 0x3eb)) {
    (**(code **)(lVar3 + 0x1670))(0x92c0);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"Failed to unmap buffer!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5AtomicCountersArrayIndexing.cpp"
                    ,0xa5);
    this_01 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Invalid data rendered. Expected Data");
    std::operator<<((ostream *)this_00," (");
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::operator<<((ostream *)this_00,", ");
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::operator<<((ostream *)this_00,", ");
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::operator<<((ostream *)this_00,", ");
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::operator<<((ostream *)this_00,") Result Data");
    std::operator<<((ostream *)this_00," (");
    pMVar4 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value);
    std::operator<<(&(pMVar4->m_str).super_basic_ostream<char,_std::char_traits<char>_>," ,");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,value + 1);
    std::operator<<(&(pMVar4->m_str).super_basic_ostream<char,_std::char_traits<char>_>," ,");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,value + 2);
    std::operator<<(&(pMVar4->m_str).super_basic_ostream<char,_std::char_traits<char>_>," ,");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,value + 3);
    std::operator<<(&(pMVar4->m_str).super_basic_ostream<char,_std::char_traits<char>_>,")");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    (**(code **)(lVar3 + 0x1670))(0x92c0);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"Failed to unmap buffer!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5AtomicCountersArrayIndexing.cpp"
                    ,0x9e);
    this_01 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
    description = "Fail";
    testResult = QP_TEST_RESULT_FAIL;
  }
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GPUShader5AtomicCountersArrayIndexing::iterate(void)
{
	initTest();

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Do the computations */
	gl.useProgram(m_program_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not use program object!");

	gl.dispatchCompute(10, /* num_groups_x */
					   10, /* num_groups_y */
					   1); /* num_groups_z */
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to dispatch compute operation!");

	/* Map the buffer object storage into user space */
	glw::GLuint* bufferData =
		(glw::GLuint*)gl.mapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, /* offset */
										m_atomic_counters_array_size * sizeof(glw::GLuint), GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to map buffer range to client space!");

	/* Compare the result values with reference value */
	const glw::GLuint expectedResult = 1000;

	if (expectedResult != bufferData[0] || expectedResult + 1 != bufferData[1] || expectedResult + 2 != bufferData[2] ||
		expectedResult + 3 != bufferData[3])
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Invalid data rendered. Expected Data"
						   << " (" << expectedResult << ", " << expectedResult << ", " << expectedResult << ", "
						   << expectedResult << ") Result Data"
						   << " (" << bufferData[0] << " ," << bufferData[1] << " ," << bufferData[2] << " ,"
						   << bufferData[3] << ")" << tcu::TestLog::EndMessage;

		gl.unmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to unmap buffer!");

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	gl.unmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to unmap buffer!");

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}